

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

void __thiscall
pg::DTLSolver::attractVertices
          (DTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G,int max_prio)

{
  uint uVar1;
  Game *pGVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  bool bVar5;
  ulong uVar6;
  ostream *poVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  uint *puVar12;
  bool bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  _label_vertex local_48;
  bitset *local_38;
  
  pGVar2 = (this->super_Solver).game;
  piVar10 = pGVar2->_inedges;
  iVar8 = pGVar2->_firstins[v];
  uVar15 = piVar10[iVar8];
  if (uVar15 != 0xffffffff) {
    piVar10 = piVar10 + iVar8;
    local_38 = G;
    do {
      uVar6 = (ulong)(int)uVar15;
      puVar3 = Z->_bits;
      uVar16 = uVar6 >> 6;
      uVar14 = 1L << (uVar6 & 0x3f);
      if ((puVar3[uVar16] >> (uVar6 & 0x3f) & 1) == 0) {
        if (((R->_bits[uVar16] & uVar14) != 0) &&
           ((max_prio < 0 || (((this->super_Solver).game)->_priority[uVar6] <= max_prio)))) {
          pGVar2 = (this->super_Solver).game;
          puVar4 = (pGVar2->_owner)._bits;
          if ((uint)((puVar4[uVar16] & uVar14) != 0) != pl) {
            uVar1 = pGVar2->_outedges[pGVar2->_firstouts[uVar6]];
            if (uVar1 != 0xffffffff) {
              puVar12 = (uint *)(pGVar2->_outedges + (long)pGVar2->_firstouts[uVar6] + 1);
              bVar13 = false;
              do {
                if (((local_38->_bits[(ulong)(long)(int)uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) ==
                     0) || ((puVar3[(ulong)(long)(int)uVar1 >> 6] & 1L << ((ulong)uVar1 & 0x3f)) !=
                            0)) {
                  bVar5 = true;
                }
                else {
                  bVar13 = true;
                  bVar5 = false;
                }
                if (!bVar5) break;
                uVar1 = *puVar12;
                puVar12 = puVar12 + 1;
              } while (uVar1 != 0xffffffff);
              if (bVar13) goto LAB_0018160f;
            }
          }
          puVar3[uVar16] = puVar3[uVar16] | uVar14;
          iVar8 = -1;
          if ((uint)((puVar4[uVar16] & uVar14) != 0) == pl) {
            iVar8 = v;
          }
          this->str[uVar6] = iVar8;
          iVar8 = (this->Q).pointer;
          (this->Q).pointer = iVar8 + 1;
          (this->Q).queue[iVar8] = uVar15;
          if (2 < (this->super_Solver).trace) {
            poVar7 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_48.g = (this->super_Solver).game;
            local_48.v = uVar15;
            poVar7 = operator<<(poVar7,&local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m by \x1b[1;36m",0xe);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m",3);
            poVar7 = (this->super_Solver).logger;
            if ((uint)(((((this->super_Solver).game)->_owner)._bits[uVar16] & uVar14) != 0) == pl) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," (via ",6);
              local_48.g = (this->super_Solver).game;
              local_48.v = v;
              poVar7 = operator<<(poVar7,&local_48);
              lVar9 = 1;
              pcVar11 = ")";
            }
            else {
              lVar9 = 9;
              pcVar11 = " (forced)";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,lVar9);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
        }
      }
      else if (((uint)(((((this->super_Solver).game)->_owner)._bits[uVar16] & uVar14) != 0) == pl)
              && (this->str[uVar6] == -1)) {
        this->str[uVar6] = v;
      }
LAB_0018160f:
      uVar15 = piVar10[1];
      piVar10 = piVar10 + 1;
    } while (uVar15 != 0xffffffff);
  }
  return;
}

Assistant:

void
DTLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z, bitset &G, const int max_prio)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from] and (max_prio < 0 or priority(from) <= max_prio)) {
            if (owner(from) != pl) {
                // check if opponent can escape
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !Z[to]) {
                        escapes = true;
                        break;
                    }
                }
                if (escapes) continue;
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}